

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowDebugLogWindow(bool *p_open)

{
  char *text_end;
  ImGuiDebugLogFlags *flags;
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  _func_void_void_ptr_char_ptr *p_Var4;
  int *piVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiID id_00;
  char *pcVar9;
  int iVar10;
  char *text_end_00;
  long lVar11;
  long lVar12;
  char *pcVar13;
  ImGuiContext *g;
  ImVec2 IVar14;
  undefined1 auVar15 [16];
  ImGuiID id;
  ImGuiListClipper clipper;
  ImGuiID local_a4;
  ImVec2 *local_a0;
  ImGuiListClipper local_98;
  ImVec2 *local_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 extraout_XMM0_Qb;
  
  pIVar6 = GImGui;
  uVar2 = (GImGui->NextWindowData).Flags;
  if ((uVar2 & 2) == 0) {
    fVar1 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar2 | 2;
    (pIVar6->NextWindowData).SizeVal.x = 0.0;
    (pIVar6->NextWindowData).SizeVal.y = fVar1 * 12.0;
    (pIVar6->NextWindowData).SizeCond = 4;
  }
  bVar8 = Begin("Dear ImGui Debug Log",p_open,0);
  pIVar7 = GImGui;
  if ((bVar8) &&
     (GImGui->CurrentWindow->WriteAccessed = true, pIVar7->CurrentWindow->BeginCount < 2)) {
    AlignTextToFramePadding();
    Text("Log events:");
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    flags = &pIVar6->DebugLogFlags;
    CheckboxFlags("All",flags,0x3f);
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    CheckboxFlags("ActiveId",flags,1);
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    CheckboxFlags("Focus",flags,2);
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    CheckboxFlags("Popup",flags,4);
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    CheckboxFlags("Nav",flags,8);
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    CheckboxFlags("Clipper",flags,0x10);
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    CheckboxFlags("IO",flags,0x20);
    bVar8 = SmallButton("Clear");
    if (bVar8) {
      ImGuiTextBuffer::clear(&pIVar6->DebugLogBuf);
      ImGuiTextIndex::clear(&pIVar6->DebugLogIndex);
    }
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
    }
    bVar8 = SmallButton("Copy");
    if ((bVar8) &&
       (p_Var4 = (GImGui->IO).SetClipboardTextFn, p_Var4 != (_func_void_void_ptr_char_ptr *)0x0)) {
      pcVar9 = (pIVar6->DebugLogBuf).Buf.Data;
      pcVar13 = ImGuiTextBuffer::EmptyString;
      if (pcVar9 != (char *)0x0) {
        pcVar13 = pcVar9;
      }
      (*p_Var4)((GImGui->IO).ClipboardUserData,pcVar13);
    }
    pIVar7 = GImGui;
    local_98.DisplayStart = 0;
    local_98.DisplayEnd = 0;
    GImGui->CurrentWindow->WriteAccessed = true;
    id_00 = ImGuiWindow::GetID(pIVar7->CurrentWindow,"##log",(char *)0x0);
    BeginChildEx("##log",id_00,(ImVec2 *)&local_98,true,0xc000);
    local_98.DisplayStart = 0;
    local_98.DisplayEnd = 0;
    local_98.StartPosY = 0.0;
    local_98._20_4_ = 0;
    local_98.TempData = (void *)0x0;
    local_98.ItemsCount = -1;
    local_98.ItemsHeight = 0.0;
    ImGuiListClipper::Begin(&local_98,(pIVar6->DebugLogIndex).LineOffsets.Size,-1.0);
    local_a0 = &(pIVar6->LastItemData).Rect.Min;
    local_70 = &(pIVar6->LastItemData).Rect.Max;
    while (bVar8 = ImGuiListClipper::Step(&local_98), bVar8) {
      lVar11 = (long)local_98.DisplayStart;
      if (local_98.DisplayStart < local_98.DisplayEnd) {
        do {
          pcVar9 = (pIVar6->DebugLogBuf).Buf.Data;
          if (pcVar9 == (char *)0x0) {
            pcVar9 = ImGuiTextBuffer::EmptyString;
          }
          piVar5 = (pIVar6->DebugLogIndex).LineOffsets.Data;
          lVar12 = lVar11 + 1;
          if (lVar12 < (pIVar6->DebugLogIndex).LineOffsets.Size) {
            iVar10 = piVar5[lVar12] + -1;
          }
          else {
            iVar10 = (pIVar6->DebugLogIndex).EndOffset;
          }
          pcVar13 = pcVar9 + piVar5[lVar11];
          pcVar9 = pcVar9 + iVar10;
          TextUnformatted(pcVar13,pcVar9);
          local_68 = *local_a0;
          uStack_60 = 0;
          bVar8 = IsItemHovered(0);
          if ((bVar8) && (pcVar13 < pcVar9 + -10)) {
            local_48 = local_68.y + 0.0;
            fStack_44 = local_68.y;
            fStack_40 = local_68.y;
            fStack_3c = local_68.y;
            text_end_00 = pcVar13;
            do {
              local_a4 = 0;
              if (((*text_end_00 == '0') && ((byte)(text_end_00[1] | 0x20U) == 0x78)) &&
                 (iVar10 = __isoc99_sscanf(text_end_00 + 2,"%X",&local_a4), iVar10 == 1)) {
                if (text_end_00 == pcVar13) {
                  local_58 = ZEXT416((uint)GImGui->FontSize) << 0x20;
                }
                else {
                  auVar15._0_8_ =
                       ImFont::CalcTextSizeA
                                 (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,pcVar13,
                                  text_end_00,(char **)0x0);
                  auVar15._8_8_ = extraout_XMM0_Qb;
                  local_58._4_12_ = auVar15._4_12_;
                  local_58._0_4_ = (float)(int)(auVar15._0_4_ + 0.99999);
                }
                text_end = text_end_00 + 10;
                IVar14 = ImFont::CalcTextSizeA
                                   (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,text_end_00,
                                    text_end,(char **)0x0);
                (pIVar6->LastItemData).Rect.Min.x = local_68.x + (float)local_58._0_4_;
                (pIVar6->LastItemData).Rect.Min.y = local_48;
                (pIVar6->LastItemData).Rect.Max.x =
                     (float)(int)(IVar14.x + 0.99999) + (float)local_58._0_4_ + local_68.x;
                (pIVar6->LastItemData).Rect.Max.y = IVar14.y + local_68.y;
                bVar8 = IsMouseHoveringRect(local_a0,local_70,true);
                text_end_00 = text_end;
                if (bVar8) {
                  DebugLocateItemOnHover(local_a4);
                }
              }
              text_end_00 = text_end_00 + 1;
            } while (text_end_00 < pcVar9 + -10);
          }
          lVar11 = lVar12;
        } while (lVar12 < local_98.DisplayEnd);
      }
    }
    if ((GImGui->CurrentWindow->ScrollMax).y <= (GImGui->CurrentWindow->Scroll).y) {
      SetScrollHereY(1.0);
    }
    EndChild();
    End();
    ImGuiListClipper::End(&local_98);
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDebugLogWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 12.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Debug Log", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    AlignTextToFramePadding();
    Text("Log events:");
    SameLine(); CheckboxFlags("All", &g.DebugLogFlags, ImGuiDebugLogFlags_EventMask_);
    SameLine(); CheckboxFlags("ActiveId", &g.DebugLogFlags, ImGuiDebugLogFlags_EventActiveId);
    SameLine(); CheckboxFlags("Focus", &g.DebugLogFlags, ImGuiDebugLogFlags_EventFocus);
    SameLine(); CheckboxFlags("Popup", &g.DebugLogFlags, ImGuiDebugLogFlags_EventPopup);
    SameLine(); CheckboxFlags("Nav", &g.DebugLogFlags, ImGuiDebugLogFlags_EventNav);
    SameLine(); CheckboxFlags("Clipper", &g.DebugLogFlags, ImGuiDebugLogFlags_EventClipper);
    SameLine(); CheckboxFlags("IO", &g.DebugLogFlags, ImGuiDebugLogFlags_EventIO);

    if (SmallButton("Clear"))
    {
        g.DebugLogBuf.clear();
        g.DebugLogIndex.clear();
    }
    SameLine();
    if (SmallButton("Copy"))
        SetClipboardText(g.DebugLogBuf.c_str());
    BeginChild("##log", ImVec2(0.0f, 0.0f), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar);

    ImGuiListClipper clipper;
    clipper.Begin(g.DebugLogIndex.size());
    while (clipper.Step())
        for (int line_no = clipper.DisplayStart; line_no < clipper.DisplayEnd; line_no++)
        {
            const char* line_begin = g.DebugLogIndex.get_line_begin(g.DebugLogBuf.c_str(), line_no);
            const char* line_end = g.DebugLogIndex.get_line_end(g.DebugLogBuf.c_str(), line_no);
            TextUnformatted(line_begin, line_end);
            ImRect text_rect = g.LastItemData.Rect;
            if (IsItemHovered())
                for (const char* p = line_begin; p < line_end - 10; p++)
                {
                    ImGuiID id = 0;
                    if (p[0] != '0' || (p[1] != 'x' && p[1] != 'X') || sscanf(p + 2, "%X", &id) != 1)
                        continue;
                    ImVec2 p0 = CalcTextSize(line_begin, p);
                    ImVec2 p1 = CalcTextSize(p, p + 10);
                    g.LastItemData.Rect = ImRect(text_rect.Min + ImVec2(p0.x, 0.0f), text_rect.Min + ImVec2(p0.x + p1.x, p1.y));
                    if (IsMouseHoveringRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, true))
                        DebugLocateItemOnHover(id);
                    p += 10;
                }
        }
    if (GetScrollY() >= GetScrollMaxY())
        SetScrollHereY(1.0f);
    EndChild();

    End();
}